

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool Fossilize::Hashing::compute_hash_render_pass2
               (VkRenderPassCreateInfo2 *create_info,Hash *out_hash)

{
  bool bVar1;
  Hash HVar2;
  uint local_5c;
  uint32_t i_3;
  VkSubpassDescription2 *subpass;
  uint32_t i_2;
  VkSubpassDependency2 *dep;
  uint32_t i_1;
  VkAttachmentDescription2 *att;
  uint32_t i;
  Hasher h;
  Hash *out_hash_local;
  VkRenderPassCreateInfo2 *create_info_local;
  
  h.h = (Hash)out_hash;
  Hasher::Hasher((Hasher *)&stack0xffffffffffffffd8);
  Hasher::u32((Hasher *)&stack0xffffffffffffffd8,create_info->flags);
  Hasher::u32((Hasher *)&stack0xffffffffffffffd8,create_info->attachmentCount);
  Hasher::u32((Hasher *)&stack0xffffffffffffffd8,create_info->dependencyCount);
  Hasher::u32((Hasher *)&stack0xffffffffffffffd8,create_info->subpassCount);
  Hasher::u32((Hasher *)&stack0xffffffffffffffd8,create_info->correlatedViewMaskCount);
  Hasher::u32((Hasher *)&stack0xffffffffffffffd8,2);
  for (att._4_4_ = 0; att._4_4_ < create_info->attachmentCount; att._4_4_ = att._4_4_ + 1) {
    bVar1 = hash_attachment2((Hasher *)&stack0xffffffffffffffd8,
                             create_info->pAttachments + att._4_4_);
    if (!bVar1) {
      return false;
    }
  }
  for (dep._4_4_ = 0; dep._4_4_ < create_info->dependencyCount; dep._4_4_ = dep._4_4_ + 1) {
    bVar1 = hash_dependency2((Hasher *)&stack0xffffffffffffffd8,
                             create_info->pDependencies + dep._4_4_);
    if (!bVar1) {
      return false;
    }
  }
  subpass._4_4_ = 0;
  while( true ) {
    if (create_info->subpassCount <= subpass._4_4_) {
      for (local_5c = 0; local_5c < create_info->correlatedViewMaskCount; local_5c = local_5c + 1) {
        Hasher::u32((Hasher *)&stack0xffffffffffffffd8,create_info->pCorrelatedViewMasks[local_5c]);
      }
      bVar1 = hash_pnext_chain((StateRecorder *)0x0,(Hasher *)&stack0xffffffffffffffd8,
                               create_info->pNext,(DynamicStateInfo *)0x0,0);
      if (bVar1) {
        HVar2 = Hasher::get((Hasher *)&stack0xffffffffffffffd8);
        *(Hash *)h.h = HVar2;
      }
      return bVar1;
    }
    bVar1 = hash_subpass2((Hasher *)&stack0xffffffffffffffd8,create_info->pSubpasses + subpass._4_4_
                         );
    if (!bVar1) break;
    subpass._4_4_ = subpass._4_4_ + 1;
  }
  return false;
}

Assistant:

bool compute_hash_render_pass2(const VkRenderPassCreateInfo2 &create_info, Hash *out_hash)
{
	Hasher h;

	h.u32(create_info.flags);
	h.u32(create_info.attachmentCount);
	h.u32(create_info.dependencyCount);
	h.u32(create_info.subpassCount);
	h.u32(create_info.correlatedViewMaskCount);
	h.u32(2);

	for (uint32_t i = 0; i < create_info.attachmentCount; i++)
	{
		auto &att = create_info.pAttachments[i];
		if (!hash_attachment2(h, att))
			return false;
	}

	for (uint32_t i = 0; i < create_info.dependencyCount; i++)
	{
		auto &dep = create_info.pDependencies[i];
		if (!hash_dependency2(h, dep))
			return false;
	}

	for (uint32_t i = 0; i < create_info.subpassCount; i++)
	{
		auto &subpass = create_info.pSubpasses[i];
		if (!hash_subpass2(h, subpass))
			return false;
	}

	for (uint32_t i = 0; i < create_info.correlatedViewMaskCount; i++)
		h.u32(create_info.pCorrelatedViewMasks[i]);

	if (!hash_pnext_chain(nullptr, h, create_info.pNext, nullptr, 0))
		return false;

	*out_hash = h.get();
	return true;
}